

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::SolveSOR
          (TPZSkylMatrix<std::complex<long_double>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<long_double>_> *F,TPZFMatrix<std::complex<long_double>_> *result,
          TPZFMatrix<std::complex<long_double>_> *residual,
          TPZFMatrix<std::complex<long_double>_> *scratch,REAL overrelax,REAL *tol,int FromCurrent,
          int direction)

{
  bool bVar1;
  complex<long_double> **ppcVar2;
  complex<long_double> *pcVar3;
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  long *in_RSI;
  long *in_RDI;
  TPZBaseMatrix *in_R8;
  longdouble in_ST0;
  longdouble lVar4;
  longdouble __r;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar5;
  longdouble in_ST6;
  longdouble lVar6;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  complex<long_double> val_3;
  complex<long_double> *scratchp_1;
  complex<long_double> *diaglast_3;
  complex<long_double> *diag_3;
  int64_t offset_3;
  complex<long_double> *diaglast_2;
  complex<long_double> *diag_2;
  complex<long_double> *p_1;
  complex<long_double> val_2;
  int64_t offset_2;
  complex<long_double> *diaglast_1;
  complex<long_double> *diag_1;
  complex<long_double> *p;
  complex<long_double> val_1;
  int64_t offset_1;
  int64_t id;
  int64_t lastid;
  complex<long_double> *scratchp;
  complex<long_double> *diaglast;
  complex<long_double> *diag;
  complex<long_double> val;
  int64_t offset;
  int64_t ic;
  int64_t it;
  int64_t iinc;
  int64_t ilast;
  int64_t ifirst;
  int64_t i;
  int64_t c;
  int64_t r;
  complex<long_double> over;
  REAL res;
  complex<long_double> *__y;
  undefined2 uVar7;
  undefined6 in_stack_fffffffffffffc52;
  complex<long_double> *column;
  undefined2 uVar8;
  undefined6 in_stack_fffffffffffffc62;
  complex<long_double> *in_stack_fffffffffffffc68;
  TPZFMatrix<std::complex<long_double>_> *in_stack_fffffffffffffc70;
  TPZFMatrix<std::complex<long_double>_> *in_stack_fffffffffffffc80;
  TPZFMatrix<std::complex<long_double>_> *in_stack_fffffffffffffcc0;
  TPZFMatrix<std::complex<long_double>_> *in_stack_fffffffffffffcc8;
  TPZFMatrix<std::complex<long_double>_> local_2c8;
  complex<long_double> *local_238;
  complex<long_double> *local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  int64_t local_200;
  complex<long_double> *local_170;
  complex<long_double> *local_168;
  complex<long_double> *local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  int64_t local_130;
  long local_100;
  long local_f8;
  complex<long_double> *local_f0;
  complex<long_double> *local_e8;
  complex<long_double> *local_e0;
  complex<long_double> local_d8;
  int64_t local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  int64_t local_78;
  long local_70;
  complex<long_double> local_68;
  double local_40;
  double local_38;
  TPZBaseMatrix *local_28;
  long *local_20;
  TPZBaseMatrix *local_18;
  long *local_10;
  
  local_38 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  if (in_R8 == in_RDX) {
    std::operator<<((ostream *)&std::cout,
                    "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
  }
  else {
    local_40 = *in_stack_00000008 + *in_stack_00000008 + 1.0;
    lVar4 = in_ST0;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    if (in_R8 != (TPZBaseMatrix *)0x0) {
      lVar4 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      ::Norm(in_stack_fffffffffffffc80);
      local_40 = (double)in_ST0;
    }
    if (in_stack_00000010 == 0) {
      (**(code **)(*local_20 + 0x78))();
    }
    __r = (longdouble)local_38;
    lVar6 = (longdouble)0;
    column = SUB108(lVar6,0);
    uVar8 = (undefined2)((unkuint10)lVar6 >> 0x40);
    __y = SUB108(__r,0);
    uVar7 = (undefined2)((unkuint10)__r >> 0x40);
    lVar5 = in_ST5;
    std::complex<long_double>::complex(&local_68,__r,lVar6);
    local_70 = (**(code **)(*in_RDI + 0x60))();
    local_78 = TPZBaseMatrix::Cols(local_18);
    local_88 = 0;
    local_90 = local_70;
    local_98 = 1;
    if (in_stack_00000018 == -1) {
      local_88 = local_70 + -1;
      local_90 = 0;
      local_98 = -1;
    }
    local_a0 = 0;
    while( true ) {
      bVar1 = false;
      if (local_a0 < *local_10) {
        bVar1 = *in_stack_00000008 <= local_40 && local_40 != *in_stack_00000008;
      }
      if (!bVar1) break;
      local_40 = 0.0;
      TPZFMatrix<std::complex<long_double>_>::operator=
                (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      for (local_a8 = 0; local_a8 < local_78; local_a8 = local_a8 + 1) {
        if (in_stack_00000018 == 1) {
          for (local_80 = local_88; local_80 != local_90; local_80 = local_98 + local_80) {
            local_b0 = Size((TPZSkylMatrix<std::complex<long_double>_> *)
                            CONCAT62(in_stack_fffffffffffffc62,uVar8),(int64_t)column);
            lVar6 = (longdouble)0;
            __y = SUB108(lVar6,0);
            uVar7 = (undefined2)((unkuint10)lVar6 >> 0x40);
            lVar5 = in_ST5;
            column = __y;
            uVar8 = uVar7;
            std::complex<long_double>::complex(&local_d8,lVar6,lVar6);
            ppcVar2 = TPZVec<std::complex<long_double>_*>::operator[]
                                ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 4),local_80);
            local_e8 = *ppcVar2;
            local_f0 = TPZFMatrix<std::complex<long_double>_>::operator()
                                 (in_stack_fffffffffffffc70,(int64_t)in_stack_fffffffffffffc68,
                                  CONCAT62(in_stack_fffffffffffffc62,uVar8));
            pcVar3 = TPZFMatrix<std::complex<long_double>_>::operator()
                               (in_stack_fffffffffffffc70,(int64_t)in_stack_fffffffffffffc68,
                                CONCAT62(in_stack_fffffffffffffc62,uVar8));
            local_d8._M_value._0_8_ = *(undefined8 *)pcVar3->_M_value;
            local_d8._M_value._8_8_ = *(undefined8 *)(pcVar3->_M_value + 8);
            local_d8._M_value._16_8_ = *(undefined8 *)(pcVar3->_M_value + 0x10);
            local_d8._M_value._24_8_ = *(undefined8 *)(pcVar3->_M_value + 0x18);
            ppcVar2 = TPZVec<std::complex<long_double>_*>::operator[]
                                ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 4),local_80);
            local_e0 = *ppcVar2 + local_b0 + -1;
            local_f8 = (long)local_e0 - (long)local_e8 >> 5;
            for (local_100 = 0; local_100 <= local_f8; local_100 = local_100 + 1) {
              std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc52,uVar7),__y);
              std::complex<long_double>::operator-=
                        ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc52,uVar7),__y);
            }
          }
          for (local_80 = local_88; local_80 != local_90; local_80 = local_98 + local_80) {
            local_130 = Size((TPZSkylMatrix<std::complex<long_double>_> *)
                             CONCAT62(in_stack_fffffffffffffc62,uVar8),(int64_t)column);
            pcVar3 = TPZFMatrix<std::complex<long_double>_>::operator()
                               (in_stack_fffffffffffffc70,(int64_t)in_stack_fffffffffffffc68,
                                CONCAT62(in_stack_fffffffffffffc62,uVar8));
            local_158 = *(undefined8 *)pcVar3->_M_value;
            local_150 = *(undefined8 *)(pcVar3->_M_value + 8);
            local_148 = *(undefined8 *)(pcVar3->_M_value + 0x10);
            local_140 = *(undefined8 *)(pcVar3->_M_value + 0x18);
            local_160 = TPZFMatrix<std::complex<long_double>_>::operator()
                                  (in_stack_fffffffffffffc70,(int64_t)in_stack_fffffffffffffc68,
                                   CONCAT62(in_stack_fffffffffffffc62,uVar8));
            ppcVar2 = TPZVec<std::complex<long_double>_*>::operator[]
                                ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 4),local_80);
            local_168 = *ppcVar2 + local_130 + -1;
            ppcVar2 = TPZVec<std::complex<long_double>_*>::operator[]
                                ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 4),local_80);
            local_170 = *ppcVar2;
            while (local_170 < local_168) {
              local_168 = local_168 + -1;
              local_160 = local_160 + 1;
              std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc52,uVar7),__y);
              std::complex<long_double>::operator-=
                        ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc52,uVar7),__y);
            }
            std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc52,uVar7),__y);
            std::abs<long_double>((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc62,uVar8))
            ;
            local_40 = (double)((longdouble)local_40 + lVar4);
            lVar6 = lVar5;
            std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc52,uVar7),__y);
            std::operator/((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc52,uVar7),__y);
            TPZFMatrix<std::complex<long_double>_>::operator()
                      (in_stack_fffffffffffffc70,(int64_t)in_stack_fffffffffffffc68,
                       CONCAT62(in_stack_fffffffffffffc62,uVar8));
            std::complex<long_double>::operator+=
                      ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc52,uVar7),__y);
            lVar4 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST5;
            in_ST5 = lVar5;
            lVar5 = lVar6;
          }
        }
        else {
          for (local_80 = local_88; local_80 != local_90; local_80 = local_98 + local_80) {
            local_200 = Size((TPZSkylMatrix<std::complex<long_double>_> *)
                             CONCAT62(in_stack_fffffffffffffc62,uVar8),(int64_t)column);
            pcVar3 = TPZFMatrix<std::complex<long_double>_>::operator()
                               (in_stack_fffffffffffffc70,(int64_t)in_stack_fffffffffffffc68,
                                CONCAT62(in_stack_fffffffffffffc62,uVar8));
            local_228 = *(undefined8 *)pcVar3->_M_value;
            local_220 = *(undefined8 *)(pcVar3->_M_value + 8);
            local_218 = *(undefined8 *)(pcVar3->_M_value + 0x10);
            local_210 = *(undefined8 *)(pcVar3->_M_value + 0x18);
            local_230 = TPZFMatrix<std::complex<long_double>_>::operator()
                                  (in_stack_fffffffffffffc70,(int64_t)in_stack_fffffffffffffc68,
                                   CONCAT62(in_stack_fffffffffffffc62,uVar8));
            ppcVar2 = TPZVec<std::complex<long_double>_*>::operator[]
                                ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 4),local_80);
            local_238 = *ppcVar2 + local_200 + -1;
            ppcVar2 = TPZVec<std::complex<long_double>_*>::operator[]
                                ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 4),local_80);
            local_2c8.fWork.fNAlloc = (int64_t)*ppcVar2;
            while ((ulong)local_2c8.fWork.fNAlloc < local_238) {
              local_238 = local_238 + -1;
              local_230 = local_230 + 1;
              std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc52,uVar7),__y);
              std::complex<long_double>::operator-=
                        ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc52,uVar7),__y);
            }
            pcVar3 = TPZFMatrix<std::complex<long_double>_>::operator()
                               (in_stack_fffffffffffffc70,(int64_t)in_stack_fffffffffffffc68,
                                CONCAT62(in_stack_fffffffffffffc62,uVar8));
            *(undefined8 *)pcVar3->_M_value = local_228;
            *(undefined8 *)(pcVar3->_M_value + 8) = local_220;
            *(undefined8 *)(pcVar3->_M_value + 0x10) = local_218;
            *(undefined8 *)(pcVar3->_M_value + 0x18) = local_210;
          }
          for (local_80 = local_88; local_80 != local_90; local_80 = local_98 + local_80) {
            local_2c8.fPivot.fExtAlloc._0_8_ =
                 Size((TPZSkylMatrix<std::complex<long_double>_> *)
                      CONCAT62(in_stack_fffffffffffffc62,uVar8),(int64_t)column);
            ppcVar2 = TPZVec<std::complex<long_double>_*>::operator[]
                                ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 4),local_80);
            local_2c8.fPivot.super_TPZVec<int>.fNElements = (int64_t)*ppcVar2;
            local_2c8.fPivot.super_TPZVec<int>.fStore =
                 (int *)TPZFMatrix<std::complex<long_double>_>::operator()
                                  (in_stack_fffffffffffffc70,(int64_t)in_stack_fffffffffffffc68,
                                   CONCAT62(in_stack_fffffffffffffc62,uVar8));
            pcVar3 = TPZFMatrix<std::complex<long_double>_>::operator()
                               (in_stack_fffffffffffffc70,(int64_t)in_stack_fffffffffffffc68,
                                CONCAT62(in_stack_fffffffffffffc62,uVar8));
            local_2c8.fElem = *(complex<long_double> **)pcVar3->_M_value;
            local_2c8.fGiven = *(complex<long_double> **)(pcVar3->_M_value + 8);
            local_2c8.fSize = *(int64_t *)(pcVar3->_M_value + 0x10);
            local_2c8.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 *(_func_int ***)(pcVar3->_M_value + 0x18);
            in_stack_fffffffffffffc68 =
                 (complex<long_double> *)local_2c8.fPivot.super_TPZVec<int>.fNElements;
            TPZFMatrix<std::complex<long_double>_>::operator()
                      (in_stack_fffffffffffffc70,local_2c8.fPivot.super_TPZVec<int>.fNElements,
                       CONCAT62(in_stack_fffffffffffffc62,uVar8));
            in_stack_fffffffffffffc70 = &local_2c8;
            std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc52,uVar7),__y);
            std::complex<long_double>::operator-=
                      ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc52,uVar7),__y);
            std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc52,uVar7),__y);
            std::abs<long_double>((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc62,uVar8))
            ;
            local_40 = (double)((longdouble)local_40 + lVar4);
            lVar6 = lVar5;
            std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc52,uVar7),__y);
            std::operator/((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc52,uVar7),__y);
            TPZFMatrix<std::complex<long_double>_>::operator()
                      (in_stack_fffffffffffffc70,(int64_t)in_stack_fffffffffffffc68,
                       CONCAT62(in_stack_fffffffffffffc62,uVar8));
            std::complex<long_double>::operator+=
                      ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc52,uVar7),__y);
            pcVar3 = TPZFMatrix<std::complex<long_double>_>::operator()
                               (in_stack_fffffffffffffc70,(int64_t)in_stack_fffffffffffffc68,
                                CONCAT62(in_stack_fffffffffffffc62,uVar8));
            local_2c8.fElem = *(complex<long_double> **)pcVar3->_M_value;
            local_2c8.fGiven = *(complex<long_double> **)(pcVar3->_M_value + 8);
            local_2c8.fSize = *(int64_t *)(pcVar3->_M_value + 0x10);
            local_2c8.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 *(_func_int ***)(pcVar3->_M_value + 0x18);
            ppcVar2 = TPZVec<std::complex<long_double>_*>::operator[]
                                ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 4),local_80);
            local_2c8.fPivot.super_TPZVec<int>.fNAlloc =
                 (int64_t)(*ppcVar2 + local_2c8.fPivot.fExtAlloc._0_8_ + -1);
            while ((ulong)local_2c8.fPivot.super_TPZVec<int>.fNElements <
                   (ulong)local_2c8.fPivot.super_TPZVec<int>.fNAlloc) {
              local_2c8.fPivot.super_TPZVec<int>.fNAlloc =
                   local_2c8.fPivot.super_TPZVec<int>.fNAlloc + -0x20;
              std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc52,uVar7),__y);
              local_2c8.fPivot.super_TPZVec<int>.fStore =
                   (int *)((long)local_2c8.fPivot.super_TPZVec<int>.fStore + 0x20);
              std::complex<long_double>::operator-=
                        ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffc52,uVar7),__y);
            }
            lVar4 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST5;
            in_ST5 = lVar5;
            lVar5 = lVar6;
          }
        }
      }
      local_40 = sqrt(local_40);
      local_a0 = local_a0 + 1;
    }
    if (local_28 != (TPZBaseMatrix *)0x0) {
      (**(code **)(*in_RDI + 0x140))(in_RDI,local_20,local_18,local_28);
    }
    *local_10 = local_a0;
    *in_stack_00000008 = local_40;
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SolveSOR(int64_t & numiterations,const TPZFMatrix<TVar> &F,
                                   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch,const REAL overrelax,
                                   REAL &tol,const int FromCurrent,const int direction)  {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	REAL res = 2.*tol+1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
    TVar over = overrelax;
	int64_t r = this->Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	if(direction == -1) {
		ifirst = r-1;
		ilast = 0;
		iinc = -1;
	}
	int64_t it;
	for(it=0; it<numiterations && res > tol; it++) {
		res = 0.;
		scratch = F;
		for(int64_t ic=0; ic<c; ic++) {
			if(direction == 1) {
				//
				// compute the upper triangular part first and put into the scractch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val;
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					int64_t lastid = diag-diaglast;
					int64_t id;
					for(id=0; id<=lastid; id++) *(scratchp+id) -= *(diag-id) * val;
					/* codeguard fix
					 while( diag >= diaglast ) *scratchp++ -= *diag-- * val;
					 */
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					res += abs(val*val);
					result(i,ic) += val*over/ (*diag);
				}
			} else {
				//
				// the direction is upward
				//
				// put the lower triangular part of the multiplication into the scratch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					//					res += val*val;
					scratch(i,ic) = val;
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					//	TVar val = scratch(i,ic);
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					//val= result(i,ic);
					TVar val = scratch(i,ic);
					val -= *diaglast * result(i,ic);
					res += abs(val*val);
					val = over * val / *diaglast;
					result(i,ic) += val;
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					while( diag > diaglast ) *scratchp++ -= *diag-- * val;
				}
			}
		}
		res = sqrt(res);
	}
	if(residual) {
		this->Residual(result,F,*residual);
	}
	numiterations = it;
	tol = res;
}